

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O3

void __thiscall
btMultiBodyPoint2Point::createConstraintRows
          (btMultiBodyPoint2Point *this,btMultiBodyConstraintArray *constraintRows,
          btMultiBodyJacobianData *data,btContactSolverInfo *infoGlobal)

{
  btMultiBodySolverConstraint *solverConstraint;
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  btScalar upperLimit;
  undefined8 uVar4;
  uint uVar5;
  btRigidBody *pbVar6;
  btMultiBody *pbVar7;
  btMultiBodyPoint2Point *this_00;
  long lVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  btVector3 bVar17;
  btVector3 local_98;
  btVector3 local_88;
  btVector3 local_78;
  btVector3 *local_60;
  btVector3 *local_58;
  btMultiBodyJacobianData *local_50;
  btContactSolverInfo *local_48;
  btMultiBodyPoint2Point *local_40;
  long local_38;
  
  local_58 = &this->m_pivotInA;
  local_60 = &this->m_pivotInB;
  local_38 = 0;
  local_50 = data;
  local_48 = infoGlobal;
  local_40 = this;
  do {
    uVar5 = *(uint *)(constraintRows + 4);
    uVar9 = uVar5;
    if (uVar5 == *(uint *)(constraintRows + 8)) {
      iVar13 = uVar5 * 2;
      if (uVar5 == 0) {
        iVar13 = 1;
      }
      if ((int)uVar5 < iVar13) {
        if (iVar13 == 0) {
          pvVar10 = (void *)0x0;
        }
        else {
          pvVar10 = btAlignedAllocInternal((long)iVar13 * 0xe0,0x10);
          uVar9 = *(uint *)(constraintRows + 4);
        }
        if (0 < (int)uVar9) {
          lVar12 = 0;
          do {
            memcpy((void *)((long)pvVar10 + lVar12),
                   (void *)(*(long *)(constraintRows + 0x10) + lVar12),0xe0);
            lVar12 = lVar12 + 0xe0;
          } while ((ulong)uVar9 * 0xe0 - lVar12 != 0);
        }
        if ((*(void **)(constraintRows + 0x10) != (void *)0x0) &&
           (constraintRows[0x18] == (btMultiBodyConstraintArray)0x1)) {
          btAlignedFreeInternal(*(void **)(constraintRows + 0x10));
        }
        constraintRows[0x18] = (btMultiBodyConstraintArray)0x1;
        *(void **)(constraintRows + 0x10) = pvVar10;
        *(int *)(constraintRows + 8) = iVar13;
        uVar9 = *(uint *)(constraintRows + 4);
        infoGlobal = local_48;
        data = local_50;
      }
    }
    lVar8 = local_38;
    this_00 = local_40;
    *(uint *)(constraintRows + 4) = uVar9 + 1;
    lVar12 = *(long *)(constraintRows + 0x10);
    lVar11 = (long)(int)uVar5 * 0xe0;
    solverConstraint = (btMultiBodySolverConstraint *)(lVar12 + lVar11);
    *(btMultiBodyPoint2Point **)(lVar12 + 0xd0 + lVar11) = local_40;
    *(int *)(lVar12 + 0xd8 + lVar11) = (int)local_38;
    puVar1 = (undefined8 *)(lVar12 + 0x10 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar12 + 0x20 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar12 + 0x30 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar12 + 0x40 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar12 + 0x50 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)(lVar12 + 0x60 + lVar11);
    *puVar1 = 0;
    puVar1[1] = 0;
    iVar13 = data->m_fixedBodyId;
    *(int *)(lVar12 + 0xa8 + lVar11) = iVar13;
    *(int *)(lVar12 + 0xbc + lVar11) = iVar13;
    local_78.m_floats[0] = 0.0;
    local_78.m_floats[1] = 0.0;
    local_78.m_floats[2] = 0.0;
    local_78.m_floats[3] = 0.0;
    local_78.m_floats[local_38] = -1.0;
    local_88.m_floats._0_8_ = *(undefined8 *)local_58->m_floats;
    local_88.m_floats._8_8_ = *(undefined8 *)(local_58->m_floats + 2);
    pbVar6 = this_00->m_rigidBodyA;
    if (pbVar6 == (btRigidBody *)0x0) {
      pbVar7 = (this_00->super_btMultiBodyConstraint).m_bodyA;
      if (pbVar7 != (btMultiBody *)0x0) {
        bVar17 = btMultiBody::localPosToWorld
                           (pbVar7,(this_00->super_btMultiBodyConstraint).m_linkA,local_58);
        local_88.m_floats._8_8_ = bVar17.m_floats._8_8_;
        local_88.m_floats[0] = bVar17.m_floats[0];
        local_88.m_floats[1] = bVar17.m_floats[1];
        goto LAB_001c951d;
      }
    }
    else {
      solverConstraint->m_solverBodyIdA = (pbVar6->super_btCollisionObject).m_companionId;
      fVar14 = (this_00->m_pivotInA).m_floats[0];
      fVar15 = (this_00->m_pivotInA).m_floats[1];
      fVar16 = (this_00->m_pivotInA).m_floats[2];
      uVar4 = *(undefined8 *)(pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      local_88.m_floats[0] =
           (float)uVar4 +
           (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] * fVar16 +
           fVar14 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[0] +
           (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[1] * fVar15;
      local_88.m_floats[1] =
           (float)((ulong)uVar4 >> 0x20) +
           (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] * fVar16 +
           fVar14 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[0] +
           (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[1] * fVar15;
      local_88.m_floats._8_8_ =
           ZEXT48((uint)((pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                         [2] * fVar16 +
                         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                         [0] * fVar14 +
                         (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                         [1] * fVar15 +
                        (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2]));
LAB_001c951d:
    }
    local_98.m_floats = *&local_60->m_floats;
    pbVar6 = this_00->m_rigidBodyB;
    if (pbVar6 == (btRigidBody *)0x0) {
      pbVar7 = (this_00->super_btMultiBodyConstraint).m_bodyB;
      if (pbVar7 == (btMultiBody *)0x0) {
        fVar14 = (float)*(undefined8 *)local_60->m_floats;
        fVar15 = (float)((ulong)*(undefined8 *)local_60->m_floats >> 0x20);
        fVar16 = (float)*(undefined8 *)(local_60->m_floats + 2);
      }
      else {
        local_98 = btMultiBody::localPosToWorld
                             (pbVar7,(this_00->super_btMultiBodyConstraint).m_linkB,local_60);
        fVar16 = local_98.m_floats[2];
        fVar14 = local_98.m_floats[0];
        fVar15 = local_98.m_floats[1];
      }
    }
    else {
      solverConstraint->m_solverBodyIdB = (pbVar6->super_btCollisionObject).m_companionId;
      fVar16 = (this_00->m_pivotInB).m_floats[0];
      fVar2 = (this_00->m_pivotInB).m_floats[1];
      fVar3 = (this_00->m_pivotInB).m_floats[2];
      uVar4 = *(undefined8 *)(pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
      fVar14 = (float)uVar4 +
               (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats[2] *
               fVar3 + fVar16 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].
                                m_floats[0] +
                       (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats
                       [1] * fVar2;
      fVar15 = (float)((ulong)uVar4 >> 0x20) +
               (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats[2] *
               fVar3 + fVar16 * (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].
                                m_floats[0] +
                       (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats
                       [1] * fVar2;
      fVar16 = (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats[2] *
               fVar3 + (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [0] * fVar16 +
                       (pbVar6->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats
                       [1] * fVar2 +
               (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
      local_98.m_floats[1] = fVar15;
      local_98.m_floats[0] = fVar14;
      local_98.m_floats[2] = fVar16;
      local_98.m_floats[3] = 0.0;
    }
    upperLimit = (this_00->super_btMultiBodyConstraint).m_maxAppliedImpulse;
    btMultiBodyConstraint::fillMultiBodyConstraint
              (&this_00->super_btMultiBodyConstraint,solverConstraint,data,(btScalar *)0x0,
               (btScalar *)0x0,&local_78,&local_88,&local_98,
               (local_88.m_floats[2] - fVar16) * local_78.m_floats[2] +
               (local_88.m_floats[0] - fVar14) * local_78.m_floats[0] +
               (local_88.m_floats[1] - fVar15) * local_78.m_floats[1],infoGlobal,-upperLimit,
               upperLimit,1.0,false,0.0,0.0);
    local_38 = lVar8 + 1;
    if (local_38 == 3) {
      return;
    }
  } while( true );
}

Assistant:

void btMultiBodyPoint2Point::createConstraintRows(btMultiBodyConstraintArray& constraintRows,
		btMultiBodyJacobianData& data,
		const btContactSolverInfo& infoGlobal)
{

//	int i=1;
int numDim = BTMBP2PCONSTRAINT_DIM;
	for (int i=0;i<numDim;i++)
	{

		btMultiBodySolverConstraint& constraintRow = constraintRows.expandNonInitializing();
        //memset(&constraintRow,0xffffffff,sizeof(btMultiBodySolverConstraint));
	constraintRow.m_orgConstraint = this;
	constraintRow.m_orgDofIndex = i;
        constraintRow.m_relpos1CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal1.setValue(0,0,0);
        constraintRow.m_relpos2CrossNormal.setValue(0,0,0);
        constraintRow.m_contactNormal2.setValue(0,0,0);
        constraintRow.m_angularComponentA.setValue(0,0,0);
        constraintRow.m_angularComponentB.setValue(0,0,0);

		constraintRow.m_solverBodyIdA = data.m_fixedBodyId;
		constraintRow.m_solverBodyIdB = data.m_fixedBodyId;

		btVector3 contactNormalOnB(0,0,0);
#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST
		contactNormalOnB[i] = -1;
#else
		contactNormalOnB[i%3] = -1;
#endif


		 // Convert local points back to world
		btVector3 pivotAworld = m_pivotInA;
		if (m_rigidBodyA)
		{

			constraintRow.m_solverBodyIdA = m_rigidBodyA->getCompanionId();
			pivotAworld = m_rigidBodyA->getCenterOfMassTransform()*m_pivotInA;
		} else
		{
			if (m_bodyA)
				pivotAworld = m_bodyA->localPosToWorld(m_linkA, m_pivotInA);
		}
		btVector3 pivotBworld = m_pivotInB;
		if (m_rigidBodyB)
		{
			constraintRow.m_solverBodyIdB = m_rigidBodyB->getCompanionId();
			pivotBworld = m_rigidBodyB->getCenterOfMassTransform()*m_pivotInB;
		} else
		{
			if (m_bodyB)
				pivotBworld = m_bodyB->localPosToWorld(m_linkB, m_pivotInB);

		}

		btScalar posError = i < 3 ? (pivotAworld-pivotBworld).dot(contactNormalOnB) : 0;

#ifndef BTMBP2PCONSTRAINT_BLOCK_ANGULAR_MOTION_TEST


		fillMultiBodyConstraint(constraintRow, data, 0, 0,
															contactNormalOnB, pivotAworld, pivotBworld,						//sucks but let it be this way "for the time being"
															posError,
															infoGlobal,
															-m_maxAppliedImpulse, m_maxAppliedImpulse
															);
    //@todo: support the case of btMultiBody versus btRigidBody,
    //see btPoint2PointConstraint::getInfo2NonVirtual
#else
		const btVector3 dummy(0, 0, 0);

		btAssert(m_bodyA->isMultiDof());

		btScalar* jac1 = jacobianA(i);
		const btVector3 &normalAng = i >= 3 ? contactNormalOnB : dummy;
		const btVector3 &normalLin = i < 3 ? contactNormalOnB : dummy;

		m_bodyA->filConstraintJacobianMultiDof(m_linkA, pivotAworld, normalAng, normalLin, jac1, data.scratch_r, data.scratch_v, data.scratch_m);

		fillMultiBodyConstraint(constraintRow, data, jac1, 0,
													dummy, dummy, dummy,						//sucks but let it be this way "for the time being"
													posError,
													infoGlobal,
													-m_maxAppliedImpulse, m_maxAppliedImpulse
													);
#endif
	}
}